

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void benchmark_rmu_uncontended_waiter(testing t)

{
  closure *cl;
  int local_2c;
  undefined1 local_28 [4];
  int value;
  nsync_mu mu;
  int n;
  int i;
  testing t_local;
  
  mu.waiters._0_4_ = testing_n(t);
  local_2c = 0;
  nsync::nsync_mu_init((nsync_mu *)local_28);
  cl = closure_waiter(waiter,(closure_t_waiter_0)local_28,&local_2c);
  closure_fork(cl);
  nsync::nsync_mu_lock((nsync_mu *)local_28);
  nsync::nsync_mu_wait((nsync_mu *)local_28,int_is_1,&local_2c,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_unlock((nsync_mu *)local_28);
  for (mu.waiters._4_4_ = 0; mu.waiters._4_4_ != (int)mu.waiters;
      mu.waiters._4_4_ = mu.waiters._4_4_ + 1) {
    nsync::nsync_mu_rlock((nsync_mu *)local_28);
    nsync::nsync_mu_runlock((nsync_mu *)local_28);
  }
  nsync::nsync_mu_lock((nsync_mu *)local_28);
  local_2c = 2;
  nsync::nsync_mu_wait((nsync_mu *)local_28,int_is_3,&local_2c,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_unlock((nsync_mu *)local_28);
  return;
}

Assistant:

static void benchmark_rmu_uncontended_waiter (testing t) {
	int i;
	int n = testing_n (t);
	nsync_mu mu;
	int value = 0;
	nsync_mu_init (&mu);
	closure_fork (closure_waiter (&waiter, &mu, &value));
	nsync_mu_lock (&mu);
	nsync_mu_wait (&mu, &int_is_1, &value, NULL);
	nsync_mu_unlock (&mu);
	for (i = 0; i != n; i++) {
		nsync_mu_rlock (&mu);
		nsync_mu_runlock (&mu);
	}
	nsync_mu_lock (&mu);
	value = 2;
	nsync_mu_wait (&mu, &int_is_3, &value, NULL);
	nsync_mu_unlock (&mu);
}